

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_init.c
# Opt level: O0

GLFWbool loadCursorTheme(void)

{
  char *pcVar1;
  int *piVar2;
  long lVar3;
  bool bVar4;
  char *themeName;
  long cursorSizeLong;
  char *sizeString;
  int cursorSize;
  
  sizeString._0_4_ = 0x10;
  pcVar1 = getenv("XCURSOR_SIZE");
  if (pcVar1 != (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(pcVar1,(char **)0x0,10);
    piVar2 = __errno_location();
    if (((*piVar2 == 0) && (0 < lVar3)) && (lVar3 < 0x7fffffff)) {
      sizeString._0_4_ = (int)lVar3;
    }
  }
  pcVar1 = getenv("XCURSOR_THEME");
  _glfw.wl.cursorTheme = (*_glfw.wl.cursor.theme_load)(pcVar1,(int)sizeString,_glfw.wl.shm);
  bVar4 = _glfw.wl.cursorTheme != (wl_cursor_theme *)0x0;
  if (bVar4) {
    _glfw.wl.cursorThemeHiDPI =
         (*_glfw.wl.cursor.theme_load)(pcVar1,(int)sizeString << 1,_glfw.wl.shm);
    _glfw.wl.cursorSurface = wl_compositor_create_surface(_glfw.wl.compositor);
    _glfw.wl.cursorTimerfd = timerfd_create(1,0x80800);
  }
  else {
    _glfwInputError(0x10008,"Wayland: Failed to load default cursor theme");
  }
  sizeString._4_4_ = (uint)bVar4;
  return sizeString._4_4_;
}

Assistant:

static GLFWbool loadCursorTheme(void)
{
    int cursorSize = 16;

    const char* sizeString = getenv("XCURSOR_SIZE");
    if (sizeString)
    {
        errno = 0;
        const long cursorSizeLong = strtol(sizeString, NULL, 10);
        if (errno == 0 && cursorSizeLong > 0 && cursorSizeLong < INT_MAX)
            cursorSize = (int) cursorSizeLong;
    }

    const char* themeName = getenv("XCURSOR_THEME");

    _glfw.wl.cursorTheme = wl_cursor_theme_load(themeName, cursorSize, _glfw.wl.shm);
    if (!_glfw.wl.cursorTheme)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to load default cursor theme");
        return GLFW_FALSE;
    }

    // If this happens to be NULL, we just fallback to the scale=1 version.
    _glfw.wl.cursorThemeHiDPI =
        wl_cursor_theme_load(themeName, cursorSize * 2, _glfw.wl.shm);

    _glfw.wl.cursorSurface = wl_compositor_create_surface(_glfw.wl.compositor);
    _glfw.wl.cursorTimerfd = timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC | TFD_NONBLOCK);
    return GLFW_TRUE;
}